

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

int Abc_ObjReverseLevelNew(Abc_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  long lVar3;
  float fVar4;
  
  if ((pObj->vFanouts).nSize < 1) {
    iVar2 = 1;
  }
  else {
    lVar3 = 0;
    iVar2 = 0;
    do {
      iVar1 = Abc_ObjReverseLevel((Abc_Obj_t *)
                                  pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar3]]);
      fVar4 = (float)iVar2;
      if ((float)iVar2 <= (float)iVar1) {
        fVar4 = (float)iVar1;
      }
      iVar2 = (int)fVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (pObj->vFanouts).nSize);
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int Abc_ObjReverseLevelNew( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i, LevelCur, Level = 0;
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        LevelCur = Abc_ObjReverseLevel( pFanout );
        Level = Abc_MaxFloat( Level, LevelCur );
    }
    return Level + 1;
}